

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_error_callback(nghttp2_session *session,int lib_error_code,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [24];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  nghttp2_mem *local_60;
  nghttp2_mem *mem;
  char *pcStack_50;
  int rv;
  char *buf;
  va_list ap;
  size_t bufsize;
  char *fmt_local;
  int lib_error_code_local;
  nghttp2_session *session_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if (((session->callbacks).error_callback == (nghttp2_error_callback)0x0) &&
     ((session->callbacks).error_callback2 == (nghttp2_error_callback2)0x0)) {
    session_local._4_4_ = 0;
  }
  else {
    local_60 = &session->mem;
    ap[0].overflow_arg_area = local_118;
    ap[0]._0_8_ = &stack0x00000008;
    buf._4_4_ = 0x30;
    buf._0_4_ = 0x18;
    local_100 = in_RCX;
    local_f8 = in_R8;
    local_f0 = in_R9;
    mem._4_4_ = vsnprintf((char *)0x0,0,fmt,&buf);
    if (mem._4_4_ < 0) {
      session_local._4_4_ = -0x385;
    }
    else {
      ap[0].reg_save_area = (void *)(long)(mem._4_4_ + 1);
      pcStack_50 = (char *)nghttp2_mem_malloc(local_60,(size_t)ap[0].reg_save_area);
      if (pcStack_50 == (char *)0x0) {
        session_local._4_4_ = -0x385;
      }
      else {
        ap[0].overflow_arg_area = local_118;
        ap[0]._0_8_ = &stack0x00000008;
        buf._4_4_ = 0x30;
        buf._0_4_ = 0x18;
        mem._4_4_ = vsnprintf(pcStack_50,(size_t)ap[0].reg_save_area,fmt,&buf);
        if (mem._4_4_ < 0) {
          nghttp2_mem_free(local_60,pcStack_50);
          session_local._4_4_ = 0;
        }
        else {
          if ((session->callbacks).error_callback2 == (nghttp2_error_callback2)0x0) {
            mem._4_4_ = (*(session->callbacks).error_callback)
                                  (session,pcStack_50,(long)mem._4_4_,session->user_data);
          }
          else {
            mem._4_4_ = (*(session->callbacks).error_callback2)
                                  (session,lib_error_code,pcStack_50,(long)mem._4_4_,
                                   session->user_data);
          }
          nghttp2_mem_free(local_60,pcStack_50);
          if (mem._4_4_ == 0) {
            session_local._4_4_ = 0;
          }
          else {
            session_local._4_4_ = -0x386;
          }
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_call_error_callback(nghttp2_session *session,
                                       int lib_error_code, const char *fmt,
                                       ...) {
  size_t bufsize;
  va_list ap;
  char *buf;
  int rv;
  nghttp2_mem *mem;

  if (!session->callbacks.error_callback &&
      !session->callbacks.error_callback2) {
    return 0;
  }

  mem = &session->mem;

  va_start(ap, fmt);
  rv = vsnprintf(NULL, 0, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    return NGHTTP2_ERR_NOMEM;
  }

  bufsize = (size_t)(rv + 1);

  buf = nghttp2_mem_malloc(mem, bufsize);
  if (buf == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  va_start(ap, fmt);
  rv = vsnprintf(buf, bufsize, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    nghttp2_mem_free(mem, buf);
    /* vsnprintf may return error because of various things we can
       imagine, but typically we don't want to drop session just for
       debug callback. */
    DEBUGF("error_callback: vsnprintf failed. The template was %s\n", fmt);
    return 0;
  }

  if (session->callbacks.error_callback2) {
    rv = session->callbacks.error_callback2(session, lib_error_code, buf,
                                            (size_t)rv, session->user_data);
  } else {
    rv = session->callbacks.error_callback(session, buf, (size_t)rv,
                                           session->user_data);
  }

  nghttp2_mem_free(mem, buf);

  if (rv != 0) {
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  return 0;
}